

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O0

void __thiscall lunasvg::SVGGeometryElement::render(SVGGeometryElement *this,SVGRenderState *state)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  FillRule FVar1;
  bool bVar2;
  SVGRenderMode SVar3;
  Canvas *pCVar4;
  Transform *pTVar5;
  reference this_01;
  float strokeWidth;
  SVGMarkerPosition *markerPosition;
  const_iterator __end2;
  const_iterator __begin2;
  SVGMarkerPositionList *__range2;
  Transform local_88;
  undefined1 local_70 [8];
  SVGRenderState newState;
  SVGBlendInfo blendInfo;
  SVGRenderState *state_local;
  SVGGeometryElement *this_local;
  
  bVar2 = isRenderable(this);
  if (bVar2) {
    this_00 = &newState.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    SVGBlendInfo::SVGBlendInfo((SVGBlendInfo *)this_00,(SVGElement *)this);
    (*(this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode[10])();
    SVGRenderState::SVGRenderState((SVGRenderState *)local_70,(SVGElement *)this,state,&local_88);
    SVGRenderState::beginGroup((SVGRenderState *)local_70,(SVGBlendInfo *)this_00);
    SVar3 = SVGRenderState::mode((SVGRenderState *)local_70);
    if (SVar3 == Clipping) {
      pCVar4 = SVGRenderState::operator->((SVGRenderState *)local_70);
      Canvas::setColor(pCVar4,(Color *)&Color::White);
      pCVar4 = SVGRenderState::operator->((SVGRenderState *)local_70);
      FVar1 = this->m_clip_rule;
      pTVar5 = SVGRenderState::currentTransform((SVGRenderState *)local_70);
      Canvas::fillPath(pCVar4,&this->m_path,FVar1,pTVar5);
    }
    else {
      bVar2 = SVGPaintServer::applyPaint(&this->m_fill,(SVGRenderState *)local_70);
      if (bVar2) {
        pCVar4 = SVGRenderState::operator->((SVGRenderState *)local_70);
        FVar1 = this->m_fill_rule;
        pTVar5 = SVGRenderState::currentTransform((SVGRenderState *)local_70);
        Canvas::fillPath(pCVar4,&this->m_path,FVar1,pTVar5);
      }
      bVar2 = SVGPaintServer::applyPaint(&this->m_stroke,(SVGRenderState *)local_70);
      if (bVar2) {
        pCVar4 = SVGRenderState::operator->((SVGRenderState *)local_70);
        pTVar5 = SVGRenderState::currentTransform((SVGRenderState *)local_70);
        Canvas::strokePath(pCVar4,&this->m_path,&this->m_strokeData,pTVar5);
      }
      __end2 = std::vector<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
               ::begin(&this->m_markerPositions);
      markerPosition =
           (SVGMarkerPosition *)
           std::vector<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>::end
                     (&this->m_markerPositions);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_lunasvg::SVGMarkerPosition_*,_std::vector<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>_>
                                         *)&markerPosition), bVar2) {
        this_01 = __gnu_cxx::
                  __normal_iterator<const_lunasvg::SVGMarkerPosition_*,_std::vector<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>_>
                  ::operator*(&__end2);
        strokeWidth = StrokeData::lineWidth(&this->m_strokeData);
        SVGMarkerPosition::renderMarker(this_01,(SVGRenderState *)local_70,strokeWidth);
        __gnu_cxx::
        __normal_iterator<const_lunasvg::SVGMarkerPosition_*,_std::vector<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>_>
        ::operator++(&__end2);
      }
    }
    SVGRenderState::endGroup
              ((SVGRenderState *)local_70,
               (SVGBlendInfo *)
               &newState.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    SVGRenderState::~SVGRenderState((SVGRenderState *)local_70);
  }
  return;
}

Assistant:

void SVGGeometryElement::render(SVGRenderState& state) const
{
    if(!isRenderable())
        return;
    SVGBlendInfo blendInfo(this);
    SVGRenderState newState(this, state, localTransform());
    newState.beginGroup(blendInfo);
    if(newState.mode() == SVGRenderMode::Clipping) {
        newState->setColor(Color::White);
        newState->fillPath(m_path, m_clip_rule, newState.currentTransform());
    } else {
        if(m_fill.applyPaint(newState))
            newState->fillPath(m_path, m_fill_rule, newState.currentTransform());
        if(m_stroke.applyPaint(newState)) {
            newState->strokePath(m_path, m_strokeData, newState.currentTransform());
        }

        for(const auto& markerPosition : m_markerPositions) {
            markerPosition.renderMarker(newState, m_strokeData.lineWidth());
        }
    }

    newState.endGroup(blendInfo);
}